

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O1

bool helics::operator==(SmallBuffer *sb1,SmallBuffer *sb2)

{
  size_t __n;
  int iVar1;
  
  __n = sb1->bufferSize;
  if (__n != sb2->bufferSize) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(sb1->heap,sb2->heap,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

std::string_view to_string() const
    {
        return std::string_view{reinterpret_cast<const char*>(heap), bufferSize};
    }